

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O1

void If_Dec10MoveTo(word *pF,int nVars,int v,int p,int *Pla2Var,int *Var2Pla)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  word *pwVar7;
  uint uVar8;
  size_t __n;
  byte bVar9;
  byte bVar10;
  word *pwVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  word *pwVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  word pG [16];
  word local_b8 [17];
  
  if (p < Var2Pla[v]) {
    __assert_fail("Var2Pla[v] <= p",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0xf1,"void If_Dec10MoveTo(word *, int, int, int, int *, int *)");
  }
  iVar19 = Var2Pla[v];
  bVar5 = true;
  pwVar18 = pF;
  if (iVar19 != p) {
    uVar8 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar8 = 1;
    }
    pwVar7 = pF;
    pwVar11 = local_b8;
    bVar9 = 0;
    do {
      bVar6 = bVar9;
      pwVar18 = pwVar11;
      pwVar11 = pwVar7;
      if (nVars + -1 <= iVar19) {
        __assert_fail("iVar < nVars - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                      ,0xcc,"void If_Dec10SwapAdjacent(word *, word *, int, int)");
      }
      bVar9 = (byte)iVar19;
      if (iVar19 < 5) {
        if (0 < (int)uVar8) {
          uVar12 = PMasks[iVar19][0];
          uVar2 = PMasks[iVar19][1];
          uVar3 = PMasks[iVar19][2];
          uVar17 = 0;
          do {
            uVar4 = pwVar11[uVar17];
            bVar10 = (byte)(1 << (bVar9 & 0x1f));
            pwVar18[uVar17] =
                 (uVar4 & uVar3) >> (bVar10 & 0x3f) |
                 (uVar4 & uVar2) << (bVar10 & 0x3f) | uVar4 & uVar12;
            uVar17 = uVar17 + 1;
          } while (uVar8 != uVar17);
        }
      }
      else if (iVar19 == 5) {
        if (0 < (int)uVar8) {
          uVar12 = 0;
          do {
            uVar2 = pwVar11[uVar12];
            uVar3 = pwVar11[uVar12 + 1];
            pwVar18[uVar12] = uVar3 << 0x20 | uVar2 & 0xffffffff;
            pwVar18[uVar12 + 1] = uVar2 >> 0x20 | uVar3 & 0xffffffff00000000;
            uVar12 = uVar12 + 2;
          } while (uVar12 < uVar8);
        }
      }
      else if (0 < (int)uVar8) {
        bVar10 = bVar9 - 6;
        __n = (ulong)(uint)(1 << (bVar10 & 0x1f)) * 8;
        lVar13 = (ulong)(uint)(2 << (bVar10 & 0x1f)) * 8;
        bVar9 = bVar9 - 1;
        lVar15 = 0;
        lVar20 = 0;
        do {
          lVar21 = (lVar20 << (bVar9 & 0x3f)) + (ulong)(uint)(3 << (bVar10 & 0x1f)) * 8;
          lVar14 = lVar20 << (bVar9 & 0x3f);
          memcpy(pwVar18 + lVar15,pwVar11 + lVar15,__n);
          lVar16 = lVar20 << (bVar9 & 0x3f);
          memcpy((void *)((long)pwVar18 + lVar16 + __n),(void *)((long)pwVar11 + lVar16 + lVar13),
                 __n);
          memcpy((void *)((long)pwVar18 + lVar14 + lVar13),(void *)((long)pwVar11 + __n + lVar14),
                 __n);
          memcpy((void *)(lVar21 + (long)pwVar18),(void *)(lVar21 + (long)pwVar11),__n);
          lVar20 = lVar20 + 1;
          lVar15 = lVar15 + (ulong)(uint)(4 << (bVar10 & 0x1f));
        } while ((int)lVar15 < (int)uVar8);
      }
      Var2Pla[Pla2Var[iVar19]] = Var2Pla[Pla2Var[iVar19]] + 1;
      Var2Pla[Pla2Var[(long)iVar19 + 1]] = Var2Pla[Pla2Var[(long)iVar19 + 1]] + -1;
      puVar1 = (ulong *)(Pla2Var + iVar19);
      *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
      iVar19 = Var2Pla[v];
      pwVar7 = pwVar18;
      bVar9 = bVar6 + 1;
    } while (iVar19 != p);
    bVar5 = (bool)(bVar6 & 1);
  }
  if (!bVar5) {
    uVar8 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar8 = 1;
    }
    if (0 < (int)uVar8) {
      uVar12 = 0;
      do {
        pF[uVar12] = pwVar18[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
    }
  }
  if (Pla2Var[(uint)p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x101,"void If_Dec10MoveTo(word *, int, int, int, int *, int *)");
  }
  return;
}

Assistant:

static inline void If_Dec10MoveTo( word * pF, int nVars, int v, int p, int Pla2Var[], int Var2Pla[] )
{
    word pG[16], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( Var2Pla[v] <= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_Dec10SwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_Dec10Copy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}